

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_affixes.cpp
# Opt level: O1

UnicodeString * __thiscall
icu_63::numparse::impl::AffixPatternMatcher::getPattern
          (UnicodeString *__return_storage_ptr__,AffixPatternMatcher *this)

{
  ConstChar16Ptr local_20 [3];
  
  local_20[0].p_ = (this->fPattern).fBuffer.ptr;
  UnicodeString::UnicodeString(__return_storage_ptr__,'\x01',local_20,-1);
  return __return_storage_ptr__;
}

Assistant:

UnicodeString AffixPatternMatcher::getPattern() const {
    return fPattern.toAliasedUnicodeString();
}